

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O2

BufferCreateInfo * __thiscall
vkt::Draw::BufferCreateInfo::operator=(BufferCreateInfo *this,BufferCreateInfo *other)

{
  pointer puVar1;
  VkSharingMode VVar2;
  pointer puVar3;
  
  (this->super_VkBufferCreateInfo).sType = (other->super_VkBufferCreateInfo).sType;
  (this->super_VkBufferCreateInfo).pNext = (other->super_VkBufferCreateInfo).pNext;
  (this->super_VkBufferCreateInfo).size = (other->super_VkBufferCreateInfo).size;
  (this->super_VkBufferCreateInfo).flags = (other->super_VkBufferCreateInfo).flags;
  VVar2 = (other->super_VkBufferCreateInfo).sharingMode;
  (this->super_VkBufferCreateInfo).usage = (other->super_VkBufferCreateInfo).usage;
  (this->super_VkBufferCreateInfo).sharingMode = VVar2;
  (this->super_VkBufferCreateInfo).queueFamilyIndexCount =
       (other->super_VkBufferCreateInfo).queueFamilyIndexCount;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->m_queueFamilyIndices,&other->m_queueFamilyIndices);
  puVar1 = (this->m_queueFamilyIndices).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (pointer)0x0;
  if ((this->m_queueFamilyIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    puVar3 = puVar1;
  }
  (this->super_VkBufferCreateInfo).pQueueFamilyIndices = puVar3;
  return this;
}

Assistant:

BufferCreateInfo & BufferCreateInfo::operator= (const BufferCreateInfo &other)
{
	sType						= other.sType;
	pNext						= other.pNext;
	size						= other.size;
	usage						= other.usage;
	flags						= other.flags;
	sharingMode					= other.sharingMode;
	queueFamilyIndexCount		= other.queueFamilyIndexCount;

	m_queueFamilyIndices		= other.m_queueFamilyIndices;

	DE_ASSERT(m_queueFamilyIndices.size() == queueFamilyIndexCount);

	if (m_queueFamilyIndices.size())
	{
		pQueueFamilyIndices = &m_queueFamilyIndices[0];
	}
	else
	{
		pQueueFamilyIndices = DE_NULL;
	}

	return *this;
}